

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::visualize_accel(PathTracer *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  BVHNode *this_00;
  BVHNode *pBVar5;
  Primitive *pPVar6;
  pointer pLVar7;
  _Elt_pointer ppBVar8;
  size_t i;
  ulong uVar9;
  BVHNode *pBVar10;
  size_t i_2;
  long lVar11;
  Color c;
  Color c_00;
  Color c_01;
  Color c_02;
  double local_f0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  BVHNode *local_80;
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  tstack;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glBlendFunc(1,0);
  glLineWidth(0x3a83126f);
  glEnable(0xb71);
  local_b8 = 0x3f19999a3f19999a;
  uStack_b0 = 0x3f8000003f800000;
  local_98 = 0x3f4ccccd3f4ccccd;
  uStack_90 = 0x3f8000003f800000;
  local_a8 = 0;
  uStack_a0 = 0x3f00000000000000;
  ppBVar8 = (this->selectionHistory).c.
            super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar8 ==
      (this->selectionHistory).c.
      super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar8 = (this->selectionHistory).c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = ppBVar8[-1];
  glPolygonOffset(0x3f800000,0x3f800000);
  glEnable(0x8037);
  pBVar5 = this_00->l;
  pBVar10 = this_00->r;
  if (pBVar5 == (BVHNode *)0x0 && pBVar10 == (BVHNode *)0x0) {
    for (uVar9 = 0; uVar9 < this_00->range; uVar9 = uVar9 + 1) {
      pPVar6 = (this->bvh->super_Aggregate).primitives.
               super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               ._M_impl.super__Vector_impl_data._M_start[this_00->start + uVar9];
      (*pPVar6->_vptr_Primitive[4])(pPVar6,&local_b8);
    }
  }
  else {
    if (pBVar5 != (BVHNode *)0x0) {
      for (uVar9 = 0; uVar9 < pBVar5->range; uVar9 = uVar9 + 1) {
        pPVar6 = (this->bvh->super_Aggregate).primitives.
                 super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pBVar5->start + uVar9];
        (*pPVar6->_vptr_Primitive[4])(pPVar6,&local_b8);
      }
      pBVar10 = this_00->r;
    }
    if (pBVar10 != (BVHNode *)0x0) {
      for (uVar9 = 0; uVar9 < pBVar10->range; uVar9 = uVar9 + 1) {
        pPVar6 = (this->bvh->super_Aggregate).primitives.
                 super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[pBVar10->start + uVar9];
        (*pPVar6->_vptr_Primitive[4])(pPVar6,&local_98);
      }
    }
  }
  glDisable(0x8037);
  for (uVar9 = 0; uVar9 < this_00->range; uVar9 = uVar9 + 1) {
    pPVar6 = (this->bvh->super_Aggregate).primitives.
             super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
             ._M_impl.super__Vector_impl_data._M_start[this_00->start + uVar9];
    (*pPVar6->_vptr_Primitive[5])(pPVar6,&local_a8);
  }
  glDepthMask(0);
  std::
  stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
  ::
  stack<std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>,void>
            (&tstack);
  local_80 = this->bvh->root;
  std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>::
  emplace_back<CMU462::StaticScene::BVHNode*>
            ((deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>> *)
             &tstack,&local_80);
  while (tstack.c.
         super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         tstack.c.
         super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppBVar8 = tstack.c.
              super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (tstack.c.
        super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        tstack.c.
        super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppBVar8 = tstack.c.
                super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pBVar5 = ppBVar8[-1];
    std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
    pop_back(&tstack.c);
    c.b = 0.5;
    c.a = 0.25;
    c.r = 0.5;
    c.g = 0.5;
    BBox::draw(&pBVar5->bb,c);
    if (pBVar5->l != (BVHNode *)0x0) {
      std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
      push_back(&tstack.c,&pBVar5->l);
    }
    if (pBVar5->r != (BVHNode *)0x0) {
      std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>::
      push_back(&tstack.c,&pBVar5->r);
    }
  }
  if (this_00->l != (BVHNode *)0x0) {
    c_00.b = 1.0;
    c_00.a = 0.6;
    c_00.r = 1.0;
    c_00.g = 1.0;
    BBox::draw(&this_00->l->bb,c_00);
  }
  if (this_00->r != (BVHNode *)0x0) {
    c_01.b = 1.0;
    c_01.a = 0.6;
    c_01.r = 1.0;
    c_01.g = 1.0;
    BBox::draw(&this_00->r->bb,c_01);
  }
  glLineWidth(0x40400000);
  c_02.b = 0.0;
  c_02.a = 0.6;
  c_02.r = 1.0;
  c_02.g = 0.25;
  BBox::draw(&this_00->bb,c_02);
  if (this->show_rays == true) {
    glLineWidth(0x3f800000);
    glBegin(1);
    lVar11 = 0;
    uVar9 = 0;
    while( true ) {
      pLVar7 = (this->rayLog).
               super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->rayLog).
                         super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pLVar7) / 0x38) <= uVar9)
      break;
      local_f0 = *(double *)((long)&pLVar7->hit_t + lVar11);
      if (0.0 <= local_f0) {
        glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
      }
      else {
        glColor4f(0x3f800000,0,0,0x3dcccccd);
        local_f0 = 100000.0;
      }
      pLVar7 = (this->rayLog).
               super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *(double *)((long)&(pLVar7->d).x + lVar11);
      dVar2 = *(double *)((long)&(pLVar7->o).x + lVar11);
      dVar3 = *(double *)((long)&(pLVar7->o).y + lVar11);
      dVar4 = *(double *)((long)&(pLVar7->o).z + lVar11);
      glVertex3f((float)dVar2,CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3),
                 CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4));
      glVertex3f((float)(dVar1 * local_f0 + dVar2));
      uVar9 = uVar9 + 500;
      lVar11 = lVar11 + 28000;
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::~_Deque_base((_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                  *)&tstack);
  return;
}

Assistant:

void PathTracer::visualize_accel() const {

    glPushAttrib(GL_ENABLE_BIT);
    glDisable(GL_LIGHTING);
    glBlendFunc(GL_ONE, GL_ZERO);
    glLineWidth(.001);
    glEnable(GL_DEPTH_TEST);

    // hardcoded color settings
    Color cnode = Color(.5, .5, .5, .25);
    Color cnode_hl = Color(1., .25, .0, .6);
    Color cnode_hl_child = Color(1., 1., 1., .6);

    Color cprim_hl_left = Color(.6, .6, 1., 1);
    Color cprim_hl_right = Color(.8, .8, 1., 1);
    Color cprim_hl_edges = Color(0., 0., 0., 0.5);

    BVHNode *selected = selectionHistory.top();

    // render solid geometry (with depth offset)
    glPolygonOffset(1.0, 1.0);
    glEnable(GL_POLYGON_OFFSET_FILL);

    if (selected->isLeaf()) {
      for (size_t i = 0; i < selected->range; ++i) {
        bvh->primitives[selected->start + i]->draw(cprim_hl_left);
      }
    } else {
      if (selected->l) {
        BVHNode* child = selected->l;
        for (size_t i = 0; i < child->range; ++i) {
          bvh->primitives[child->start + i]->draw(cprim_hl_left);
        }
      }
      if (selected->r) {
        BVHNode* child = selected->r;
        for (size_t i = 0; i < child->range; ++i) {
          bvh->primitives[child->start + i]->draw(cprim_hl_right);
        }
      }
    }

    glDisable(GL_POLYGON_OFFSET_FILL);

    // draw geometry outline
    for (size_t i = 0; i < selected->range; ++i) {
      bvh->primitives[selected->start + i]->drawOutline(cprim_hl_edges);
    }

    // keep depth buffer check enabled so that mesh occluded bboxes, but
    // disable depth write so that bboxes don't occlude each other.
    glDepthMask(GL_FALSE);

    // create traversal stack
    stack<BVHNode *> tstack;

    // push initial traversal data
    tstack.push(bvh->get_root());

    // draw all BVH bboxes with non-highlighted color
    while (!tstack.empty()) {

      BVHNode *current = tstack.top();
      tstack.pop();

      current->bb.draw(cnode);
      if (current->l) tstack.push(current->l);
      if (current->r) tstack.push(current->r);
    }

    // draw selected node bbox and primitives
    if (selected->l) selected->l->bb.draw(cnode_hl_child);
    if (selected->r) selected->r->bb.draw(cnode_hl_child);

    glLineWidth(3.f);
    selected->bb.draw(cnode_hl);

    // now perform visualization of the rays
    if (show_rays) {
      glLineWidth(1.f);
      glBegin(GL_LINES);

      for (size_t i=0; i<rayLog.size(); i+=500) {

        const static double VERY_LONG = 10e4;
        double ray_t = VERY_LONG;

        // color rays that are hits yellow
        // and rays this miss all geometry red
        if (rayLog[i].hit_t >= 0.0) {
          ray_t = rayLog[i].hit_t;
          glColor4f(1.f, 1.f, 0.f, 0.1f);
        } else {
          glColor4f(1.f, 0.f, 0.f, 0.1f);
        }

        Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

        glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
        glVertex3f(end[0], end[1], end[2]);
      }
      glEnd();
    }

    glDepthMask(GL_TRUE);
    glPopAttrib();
  }